

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::python::(anonymous_namespace)::StringifySyntax_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Syntax syntax)

{
  char *pcVar1;
  string *extraout_RAX;
  LogMessage *other;
  string *extraout_RAX_00;
  char *pcVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  if ((int)this == 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "proto3";
    pcVar1 = "proto3";
  }
  else {
    if ((int)this != 2) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
                 ,0x123);
      other = internal::LogMessage::operator<<
                        (&local_48,
                         "Unsupported syntax; this generator only supports proto2 and proto3 syntax."
                        );
      internal::LogFinisher::operator=(&local_49,other);
      internal::LogMessage::~LogMessage(&local_48);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return extraout_RAX_00;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "proto2";
    pcVar1 = "proto2";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar1 + 6);
  return extraout_RAX;
}

Assistant:

string StringifySyntax(FileDescriptor::Syntax syntax) {
  switch (syntax) {
    case FileDescriptor::SYNTAX_PROTO2:
      return "proto2";
    case FileDescriptor::SYNTAX_PROTO3:
      return "proto3";
    case FileDescriptor::SYNTAX_UNKNOWN:
    default:
      GOOGLE_LOG(FATAL) << "Unsupported syntax; this generator only supports proto2 "
                    "and proto3 syntax.";
      return "";
  }
}